

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EbmlCrc32.cpp
# Opt level: O0

filepos_t __thiscall
libebml::EbmlCrc32::RenderData(EbmlCrc32 *this,IOCallback *output,bool param_2,bool param_3)

{
  uint64 uVar1;
  void *__s;
  binary *Pad;
  filepos_t Result;
  bool param_3_local;
  bool param_2_local;
  IOCallback *output_local;
  EbmlCrc32 *this_local;
  
  Pad = (binary *)0x4;
  IOCallback::writeFully(output,&this->m_crc_final,4);
  uVar1 = EbmlElement::GetDefaultSize((EbmlElement *)this);
  if (4 < uVar1) {
    uVar1 = EbmlElement::GetDefaultSize((EbmlElement *)this);
    __s = operator_new__(uVar1 - 4,(nothrow_t *)&std::nothrow);
    if (__s != (void *)0x0) {
      uVar1 = EbmlElement::GetDefaultSize((EbmlElement *)this);
      memset(__s,0,uVar1 - 4);
      uVar1 = EbmlElement::GetDefaultSize((EbmlElement *)this);
      IOCallback::writeFully(output,__s,uVar1 - 4);
      Pad = (binary *)EbmlElement::GetDefaultSize((EbmlElement *)this);
      if (__s != (void *)0x0) {
        operator_delete__(__s);
      }
    }
  }
  return (filepos_t)Pad;
}

Assistant:

filepos_t EbmlCrc32::RenderData(IOCallback & output, bool /* bForceRender */, bool /* bWithDefault */)
{
  filepos_t Result = 4;

  if (Result != 0) {
    output.writeFully(&m_crc_final, Result);
  }

  if (Result < GetDefaultSize()) {
    // pad the rest with 0
    binary *Pad = new (std::nothrow) binary[GetDefaultSize() - Result];
    if (Pad != NULL) {
      memset(Pad, 0x00, GetDefaultSize() - Result);
      output.writeFully(Pad, GetDefaultSize() - Result);

      Result = GetDefaultSize();
      delete [] Pad;
    }
  }

  return Result;
}